

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::LabeledDataset::apply(LabeledDataset *this,ADatasetTransformer *t)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_30;
  ADatasetTransformer *local_18;
  ADatasetTransformer *t_local;
  LabeledDataset *this_local;
  
  local_18 = t;
  t_local = (ADatasetTransformer *)this;
  (**t->_vptr_ADatasetTransformer)(&local_30,t,&this->inputs);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator=
            (&this->inputs,&local_30);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_30);
  bVar1 = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::empty
                    (&this->inputs);
  if (!bVar1) {
    this_00 = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator[]
                        (&this->inputs,0);
    sVar2 = std::valarray<float>::size(this_00);
    this->inputDimension = sVar2;
  }
  return;
}

Assistant:

void apply(ADatasetTransformer &t) {
        inputs = t.apply(inputs);
        if (!inputs.empty()) {
            inputDimension = inputs[0].size();
        }
    }